

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_warc.c
# Opt level: O2

int strtoi_lim(char *str,char **ep,int llim,int ulim)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  
  lVar4 = 0;
  uVar3 = 0;
  uVar1 = (ulong)(uint)ulim;
  while( true ) {
    if (((ulim < (int)(uVar3 * 10)) || ((int)uVar1 == 0)) || (9 < (byte)(str[lVar4] - 0x30U)))
    break;
    uVar3 = uVar3 * 10 + (uint)(byte)(str[lVar4] - 0x30U);
    uVar1 = (long)(int)uVar1 / 10;
    lVar4 = lVar4 + 1;
  }
  uVar2 = uVar3;
  if (ulim < (int)uVar3) {
    uVar2 = 0xfffffffe;
  }
  if ((int)uVar3 < llim) {
    uVar2 = 0xfffffffe;
  }
  *ep = str + lVar4;
  return -(uint)(lVar4 == 0) | uVar2;
}

Assistant:

static int
strtoi_lim(const char *str, const char **ep, int llim, int ulim)
{
	int res = 0;
	const char *sp;
	/* we keep track of the number of digits via rulim */
	int rulim;

	for (sp = str, rulim = ulim > 10 ? ulim : 10;
	     res * 10 <= ulim && rulim && *sp >= '0' && *sp <= '9';
	     sp++, rulim /= 10) {
		res *= 10;
		res += *sp - '0';
	}
	if (sp == str) {
		res = -1;
	} else if (res < llim || res > ulim) {
		res = -2;
	}
	*ep = (const char*)sp;
	return res;
}